

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O3

bool __thiscall IntVarEL::setVal(IntVarEL *this,int64_t v,Reason r,bool channel)

{
  Tint *pTVar1;
  int *piVar2;
  int iVar3;
  Tchar *pTVar4;
  Lit p;
  undefined7 in_register_00000009;
  bool bVar5;
  int v_00;
  int *pt;
  TrailElem local_30;
  
  if ((int)CONCAT71(in_register_00000009,channel) != 0) {
    p.x = (*(this->super_IntVar).super_Var.super_Branching._vptr_Branching[0xd])(this,v,1);
    SAT::cEnqueue(&sat,p,r);
  }
  bVar5 = false;
  if (((this->super_IntVar).min.v <= v) && (bVar5 = false, v <= (this->super_IntVar).max.v)) {
    pTVar4 = (this->super_IntVar).vals;
    if ((pTVar4 == (Tchar *)0x0) || (pTVar4[v].v != '\0')) {
      pTVar1 = &(this->super_IntVar).max;
      piVar2 = &(this->super_IntVar).changes;
      *(byte *)piVar2 = (byte)*piVar2 | 9;
      v_00 = (int)v;
      channelFix(this,v_00);
      iVar3 = (this->super_IntVar).min.v;
      if (iVar3 < v) {
        local_30.pt = &(this->super_IntVar).min.v;
        local_30.sz = 4;
        local_30.x = iVar3;
        vec<TrailElem>::push(&engine.trail,&local_30);
        (this->super_IntVar).min.v = v_00;
        piVar2 = &(this->super_IntVar).changes;
        *(byte *)piVar2 = (byte)*piVar2 | 2;
      }
      iVar3 = pTVar1->v;
      if (v < iVar3) {
        local_30.sz = 4;
        local_30.pt = &pTVar1->v;
        local_30.x = iVar3;
        vec<TrailElem>::push(&engine.trail,&local_30);
        (this->super_IntVar).max.v = v_00;
        piVar2 = &(this->super_IntVar).changes;
        *(byte *)piVar2 = (byte)*piVar2 | 4;
      }
      bVar5 = true;
      if ((this->super_IntVar).in_queue == false) {
        (this->super_IntVar).in_queue = true;
        local_30.pt = (int *)this;
        vec<IntVar_*>::push(&engine.v_queue,(IntVar **)&local_30);
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool IntVarEL::setVal(int64_t v, Reason r, bool channel) {
	assert(setValNotR(v));
	if (channel) {
		sat.cEnqueue(getLit(v, LR_EQ), r);
	}
	if (!indomain(v)) {
		assert(sat.confl);
		return false;
	}
	changes |= EVENT_C | EVENT_F;
	channelFix(static_cast<int>(v));
	if (min < v) {
		min = static_cast<int>(v);
		changes |= EVENT_L;
	}
	if (max > v) {
		max = static_cast<int>(v);
		changes |= EVENT_U;
	}
#if INT_DOMAIN_LIST
	vals_count = 1;
#endif
	pushInQueue();
	return true;
}